

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

double __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_number
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  bool *pbVar2;
  bool bVar3;
  xpath_value_type xVar4;
  size_t sVar5;
  xpath_node *pxVar6;
  char_t *pcVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  xpath_ast_node *local_2c0;
  xpath_ast_node *local_2b8;
  xpath_string local_228;
  undefined1 local_210 [8];
  xpath_allocator_capture cr_6;
  undefined1 local_1d8 [8];
  xpath_allocator_capture cr_5;
  double r_2;
  double r_1;
  undefined1 local_190 [8];
  xpath_allocator_capture cri;
  xpath_node *it;
  xpath_node_set_raw ns;
  double r;
  xpath_allocator_capture cr_4;
  undefined1 local_108 [8];
  xpath_allocator_capture cr_3;
  undefined1 local_d0 [8];
  xpath_allocator_capture cr_2;
  undefined1 local_98 [8];
  xpath_allocator_capture cr_1;
  xpath_node_set_raw local_68;
  undefined1 local_48 [8];
  xpath_allocator_capture cr;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  cr._state._error = (bool *)stack;
  switch(this->_type) {
  case '\t':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)(dVar9 + dVar8);
    break;
  case '\n':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)(dVar9 - dVar8);
    break;
  case '\v':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)(dVar9 * dVar8);
    break;
  case '\f':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)(dVar9 / dVar8);
    break;
  case '\r':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)fmod(dVar9,dVar8);
    break;
  case '\x0e':
    dVar9 = eval_number(this->_left,c,stack);
    this_local = (xpath_ast_node *)((ulong)dVar9 ^ 0x8000000000000000);
    break;
  case '\x13':
    this_local = (xpath_ast_node *)(this->_data).variable;
    break;
  case '\x14':
    cVar1 = this->_rettype;
    xVar4 = xpath_variable::type((this->_data).variable);
    if ((int)cVar1 != xVar4) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x28ea,
                    "double pugi::impl::(anonymous namespace)::xpath_ast_node::eval_number(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x02') {
      dVar9 = xpath_variable::get_number((this->_data).variable);
      return dVar9;
    }
  default:
    cVar1 = this->_rettype;
    if (cVar1 == '\x01') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_210,*(xpath_allocator **)cr._state._error);
      eval_string(&local_228,this,c,(xpath_stack *)cr._state._error);
      pcVar7 = xpath_string::c_str(&local_228);
      this_local = (xpath_ast_node *)convert_string_to_number(pcVar7);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_210);
    }
    else if (cVar1 == '\x03') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_1d8,*(xpath_allocator **)cr._state._error);
      eval_string((xpath_string *)&cr_6._state._error,this,c,(xpath_stack *)cr._state._error);
      pcVar7 = xpath_string::c_str((xpath_string *)&cr_6._state._error);
      this_local = (xpath_ast_node *)convert_string_to_number(pcVar7);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_1d8);
    }
    else {
      if (cVar1 != '\x04') {
        __assert_fail("false && \"Wrong expression for return type number\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x2907,
                      "double pugi::impl::(anonymous namespace)::xpath_ast_node::eval_number(const xpath_context &, const xpath_stack &)"
                     );
      }
      bVar3 = eval_boolean(this,c,(xpath_stack *)cr._state._error);
      this_local = (xpath_ast_node *)(double)bVar3;
    }
    break;
  case '\x15':
    sVar5 = c->size;
    auVar10._8_4_ = (int)(sVar5 >> 0x20);
    auVar10._0_8_ = sVar5;
    auVar10._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
    break;
  case '\x16':
    sVar5 = c->position;
    auVar11._8_4_ = (int)(sVar5 >> 0x20);
    auVar11._0_8_ = sVar5;
    auVar11._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
    break;
  case '\x17':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)local_48,stack->result);
    eval_node_set(&local_68,this->_left,c,(xpath_stack *)cr._state._error,nodeset_eval_all);
    sVar5 = xpath_node_set_raw::size(&local_68);
    auVar12._8_4_ = (int)(sVar5 >> 0x20);
    auVar12._0_8_ = sVar5;
    auVar12._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_48);
    break;
  case '(':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)local_98,stack->result);
    string_value((xpath_string *)&cr_2._state._error,&c->n,*(xpath_allocator **)cr._state._error);
    sVar5 = xpath_string::length((xpath_string *)&cr_2._state._error);
    auVar13._8_4_ = (int)(sVar5 >> 0x20);
    auVar13._0_8_ = sVar5;
    auVar13._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_98);
    break;
  case ')':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)local_d0,stack->result);
    eval_string((xpath_string *)&cr_3._state._error,this->_left,c,(xpath_stack *)cr._state._error);
    sVar5 = xpath_string::length((xpath_string *)&cr_3._state._error);
    auVar14._8_4_ = (int)(sVar5 >> 0x20);
    auVar14._0_8_ = sVar5;
    auVar14._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_d0);
    break;
  case '2':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)local_108,stack->result);
    string_value((xpath_string *)&cr_4._state._error,&c->n,*(xpath_allocator **)cr._state._error);
    pcVar7 = xpath_string::c_str((xpath_string *)&cr_4._state._error);
    this_local = (xpath_ast_node *)convert_string_to_number(pcVar7);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_108);
    break;
  case '3':
    this_local = (xpath_ast_node *)eval_number(this->_left,c,stack);
    break;
  case '4':
    xpath_allocator_capture::xpath_allocator_capture((xpath_allocator_capture *)&r,stack->result);
    ns._eos = (xpath_node *)0x0;
    eval_node_set((xpath_node_set_raw *)&it,this->_left,c,(xpath_stack *)cr._state._error,
                  nodeset_eval_all);
    for (cri._state._error = (bool *)xpath_node_set_raw::begin((xpath_node_set_raw *)&it);
        pbVar2 = cri._state._error, pxVar6 = xpath_node_set_raw::end((xpath_node_set_raw *)&it),
        (xpath_node *)pbVar2 != pxVar6; cri._state._error = cri._state._error + 0x10) {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_190,*(xpath_allocator **)cr._state._error);
      string_value((xpath_string *)&r_1,(xpath_node *)cri._state._error,
                   *(xpath_allocator **)cr._state._error);
      pcVar7 = xpath_string::c_str((xpath_string *)&r_1);
      dVar9 = convert_string_to_number(pcVar7);
      ns._eos = (xpath_node *)(dVar9 + (double)ns._eos);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_190);
    }
    this_local = (xpath_ast_node *)ns._eos;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&r);
    break;
  case '5':
    local_2b8 = (xpath_ast_node *)eval_number(this->_left,c,stack);
    if (!NAN((double)local_2b8)) {
      local_2b8 = (xpath_ast_node *)floor((double)local_2b8);
    }
    this_local = local_2b8;
    break;
  case '6':
    local_2c0 = (xpath_ast_node *)eval_number(this->_left,c,stack);
    if (!NAN((double)local_2c0)) {
      cr_5._state._error = (bool *)local_2c0;
      local_2c0 = (xpath_ast_node *)ceil((double)local_2c0);
    }
    this_local = local_2c0;
    break;
  case '7':
    dVar9 = eval_number(this->_left,c,stack);
    this_local = (xpath_ast_node *)round_nearest_nzero(dVar9);
  }
  return (double)this_local;
}

Assistant:

double eval_number(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_add:
				return _left->eval_number(c, stack) + _right->eval_number(c, stack);

			case ast_op_subtract:
				return _left->eval_number(c, stack) - _right->eval_number(c, stack);

			case ast_op_multiply:
				return _left->eval_number(c, stack) * _right->eval_number(c, stack);

			case ast_op_divide:
				return _left->eval_number(c, stack) / _right->eval_number(c, stack);

			case ast_op_mod:
				return fmod(_left->eval_number(c, stack), _right->eval_number(c, stack));

			case ast_op_negate:
				return -_left->eval_number(c, stack);

			case ast_number_constant:
				return _data.number;

			case ast_func_last:
				return static_cast<double>(c.size);

			case ast_func_position:
				return static_cast<double>(c.position);

			case ast_func_count:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_node_set(c, stack, nodeset_eval_all).size());
			}

			case ast_func_string_length_0:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(string_value(c.n, stack.result).length());
			}

			case ast_func_string_length_1:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_string(c, stack).length());
			}

			case ast_func_number_0:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(string_value(c.n, stack.result).c_str());
			}

			case ast_func_number_1:
				return _left->eval_number(c, stack);

			case ast_func_sum:
			{
				xpath_allocator_capture cr(stack.result);

				double r = 0;

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* it = ns.begin(); it != ns.end(); ++it)
				{
					xpath_allocator_capture cri(stack.result);

					r += convert_string_to_number(string_value(*it, stack.result).c_str());
				}

				return r;
			}

			case ast_func_floor:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? floor(r) : r;
			}

			case ast_func_ceiling:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? ceil(r) : r;
			}

			case ast_func_round:
				return round_nearest_nzero(_left->eval_number(c, stack));

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_number)
					return _data.variable->get_number();
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return eval_boolean(c, stack) ? 1 : 0;

				case xpath_type_string:
				{
					xpath_allocator_capture cr(stack.result);

					return convert_string_to_number(eval_string(c, stack).c_str());
				}

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.result);

					return convert_string_to_number(eval_string(c, stack).c_str());
				}

				default:
					assert(false && "Wrong expression for return type number"); // unreachable
					return 0;
				}

			}
			}
		}